

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

ssize_t Curl_send_plain(connectdata *conn,int num,void *mem,size_t len,CURLcode *code)

{
  Curl_easy *data;
  int *piVar1;
  char *pcVar2;
  char local_c8 [8];
  char buffer [128];
  ssize_t sStack_40;
  int err;
  ssize_t bytes_written;
  curl_socket_t sockfd;
  CURLcode *code_local;
  size_t len_local;
  void *mem_local;
  int num_local;
  connectdata *conn_local;
  
  if ((*(uint *)&(conn->bits).field_0x4 >> 0x1b & 1) == 0) {
    sStack_40 = send(conn->sock[num],mem,len,0x4000);
  }
  else {
    sStack_40 = sendto(conn->sock[num],mem,len,0x20000000,(sockaddr *)conn->ip_addr->ai_addr,
                       conn->ip_addr->ai_addrlen);
    *(uint *)&(conn->bits).field_0x4 = *(uint *)&(conn->bits).field_0x4 & 0xf7ffffff;
  }
  *code = CURLE_OK;
  if (sStack_40 == -1) {
    piVar1 = __errno_location();
    buffer._124_4_ = *piVar1;
    if ((((buffer._124_4_ == 0xb) || (buffer._124_4_ == 0xb)) || (buffer._124_4_ == 4)) ||
       (buffer._124_4_ == 0x73)) {
      sStack_40 = 0;
      *code = CURLE_AGAIN;
    }
    else {
      data = conn->data;
      pcVar2 = Curl_strerror(buffer._124_4_,local_c8,0x80);
      Curl_failf(data,"Send failure: %s",pcVar2);
      (conn->data->state).os_errno = buffer._124_4_;
      *code = CURLE_SEND_ERROR;
    }
  }
  return sStack_40;
}

Assistant:

ssize_t Curl_send_plain(struct connectdata *conn, int num,
                        const void *mem, size_t len, CURLcode *code)
{
  curl_socket_t sockfd = conn->sock[num];
  ssize_t bytes_written;
  /* WinSock will destroy unread received data if send() is
     failed.
     To avoid lossage of received data, recv() must be
     performed before every send() if any incoming data is
     available. */
  pre_receive_plain(conn, num);

#if defined(MSG_FASTOPEN) && !defined(TCP_FASTOPEN_CONNECT) /* Linux */
  if(conn->bits.tcp_fastopen) {
    bytes_written = sendto(sockfd, mem, len, MSG_FASTOPEN,
                           conn->ip_addr->ai_addr, conn->ip_addr->ai_addrlen);
    conn->bits.tcp_fastopen = FALSE;
  }
  else
#endif
    bytes_written = swrite(sockfd, mem, len);

  *code = CURLE_OK;
  if(-1 == bytes_written) {
    int err = SOCKERRNO;

    if(
#ifdef WSAEWOULDBLOCK
      /* This is how Windows does it */
      (WSAEWOULDBLOCK == err)
#else
      /* errno may be EWOULDBLOCK or on some systems EAGAIN when it returned
         due to its inability to send off data without blocking. We therefore
         treat both error codes the same here */
      (EWOULDBLOCK == err) || (EAGAIN == err) || (EINTR == err) ||
      (EINPROGRESS == err)
#endif
      ) {
      /* this is just a case of EWOULDBLOCK */
      bytes_written = 0;
      *code = CURLE_AGAIN;
    }
    else {
      char buffer[STRERROR_LEN];
      failf(conn->data, "Send failure: %s",
            Curl_strerror(err, buffer, sizeof(buffer)));
      conn->data->state.os_errno = err;
      *code = CURLE_SEND_ERROR;
    }
  }
  return bytes_written;
}